

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddLinkExtension(cmComputeLinkInformation *this,char *e,LinkType type)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (e == (char *)0x0) {
    return;
  }
  if (*e == '\0') {
    return;
  }
  if (type == LinkShared) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar1 = strlen(e);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,e,e + sVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->SharedLinkExtensions,&local_38);
  }
  else {
    if (type != LinkStatic) goto LAB_0033af69;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar1 = strlen(e);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,e,e + sVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->StaticLinkExtensions,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
LAB_0033af69:
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  sVar1 = strlen(e);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,e,e + sVar1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->LinkExtensions,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLinkExtension(const char* e, LinkType type)
{
  if(e && *e)
    {
    if(type == LinkStatic)
      {
      this->StaticLinkExtensions.push_back(e);
      }
    if(type == LinkShared)
      {
      this->SharedLinkExtensions.push_back(e);
      }
    this->LinkExtensions.push_back(e);
    }
}